

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::child_pos(Tree *this,size_t node,size_t ch)

{
  size_t node_00;
  size_t sVar1;
  
  node_00 = first_child(this,node);
  sVar1 = 0;
  for (; (node_00 != 0xffffffffffffffff && (node_00 != ch)); node_00 = next_sibling(this,node_00)) {
    sVar1 = sVar1 + 1;
  }
  if (node_00 == 0xffffffffffffffff) {
    sVar1 = 0xffffffffffffffff;
  }
  return sVar1;
}

Assistant:

size_t Tree::child_pos(size_t node, size_t ch) const
{
    size_t count = 0;
    for(size_t i = first_child(node); i != NONE; i = next_sibling(i))
    {
        if(i == ch)
            return count;
        ++count;
    }
    return npos;
}